

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O0

bool cfd::core::ScriptOperator::IsValid(string *message)

{
  bool bVar1;
  __type _Var2;
  int __val;
  ulong uVar3;
  char *__nptr;
  char *in_stack_ffffffffffffff48;
  string *this;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  string *__return_storage_ptr__;
  _Self local_a0;
  _Self in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  int iVar4;
  undefined4 in_stack_ffffffffffffff74;
  string local_80;
  string local_60 [8];
  string opcode_text;
  int num;
  string *message_local;
  
  uVar3 = ::std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    bVar1 = ::std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::ScriptOperator,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::ScriptOperator>_>_>
            ::empty((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::ScriptOperator,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::ScriptOperator>_>_>
                     *)g_operator_text_map_abi_cxx11_);
    if (bVar1) {
      message_local._7_1_ = 0;
    }
    else {
      bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                                in_stack_ffffffffffffff48);
      if ((bVar1) ||
         (bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50)
                                    ,in_stack_ffffffffffffff48), bVar1)) {
        message_local._7_1_ = 1;
      }
      else {
        uVar3 = ::std::__cxx11::string::length();
        if (3 < uVar3) {
          this = (string *)(opcode_text.field_2._M_local_buf + 8);
          ::std::__cxx11::string::substr((ulong)this,(ulong)message);
          __nptr = (char *)::std::__cxx11::string::c_str();
          __val = atoi(__nptr);
          ::std::__cxx11::string::~string(this);
          __return_storage_ptr__ = &local_80;
          iVar4 = __val;
          ::std::__cxx11::to_string(__return_storage_ptr__,__val);
          ::std::operator+((char *)__return_storage_ptr__,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(iVar4,in_stack_ffffffffffffff50));
          ::std::__cxx11::string::~string((string *)&local_80);
          _Var2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70)
                                    ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)in_stack_ffffffffffffff68._M_node);
          if (((_Var2) && (0 < __val)) && (__val < 0x11)) {
            message_local._7_1_ = 1;
            iVar4 = 1;
          }
          else {
            iVar4 = 0;
          }
          ::std::__cxx11::string::~string(local_60);
          if (iVar4 != 0) goto LAB_003fbcac;
        }
        ::std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::ScriptOperator,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::ScriptOperator>_>_>
        ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::ScriptOperator,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::ScriptOperator>_>_>
                *)g_operator_text_map_abi_cxx11_,message);
        local_a0._M_node =
             (_Base_ptr)
             ::std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::ScriptOperator,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::ScriptOperator>_>_>
             ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::ScriptOperator,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::ScriptOperator>_>_>
                    *)g_operator_text_map_abi_cxx11_);
        message_local._7_1_ = ::std::operator!=((_Self *)&stack0xffffffffffffff68,&local_a0);
      }
    }
  }
  else {
    message_local._7_1_ = 0;
  }
LAB_003fbcac:
  return (bool)(message_local._7_1_ & 1);
}

Assistant:

bool ScriptOperator::IsValid(const std::string& message) {
  if (message.empty()) return false;
  if (g_operator_text_map.empty()) return false;
  if ((message == "OP_0") || (message == "OP_1NEGATE")) {
    return true;
  } else if (message.length() >= 4) {
    int num = std::atoi(message.substr(3).c_str());
    std::string opcode_text = "OP_" + std::to_string(num);
    if ((message == opcode_text) && (num >= 1) && (num <= 16)) {
      return true;
    }
  }
  return (g_operator_text_map.find(message) != g_operator_text_map.end());
}